

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

double MakeExponentiallyDistributed(uint64_t uniform)

{
  long lVar1;
  ulong in_RDI;
  long in_FS_OFFSET;
  double dVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dVar2 = log1p((double)(in_RDI >> 0xb) * -1.1102230246251565e-16);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return -dVar2;
  }
  __stack_chk_fail();
}

Assistant:

double MakeExponentiallyDistributed(uint64_t uniform) noexcept
{
    // To convert uniform into an exponentially-distributed double, we use two steps:
    // - Convert uniform into a uniformly-distributed double in range [0, 1), use the expression
    //   ((uniform >> 11) * 0x1.0p-53), as described in https://prng.di.unimi.it/ under
    //   "Generating uniform doubles in the unit interval". Call this value x.
    // - Given an x in uniformly distributed in [0, 1), we find an exponentially distributed value
    //   by applying the quantile function to it. For the exponential distribution with mean 1 this
    //   is F(x) = -log(1 - x).
    //
    // Combining the two, and using log1p(x) = log(1 + x), we obtain the following:
    return -std::log1p((uniform >> 11) * -0x1.0p-53);
}